

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::generateScaleOption
               (int32_t magnitude,DecNum *arbitrary,UnicodeString *sb,UErrorCode *status)

{
  DecimalQuantity dq;
  UnicodeString local_60;
  
  DecimalQuantity::DecimalQuantity(&dq);
  if (arbitrary == (DecNum *)0x0) {
    DecimalQuantity::setToInt(&dq,1);
  }
  else {
    DecimalQuantity::setToDecNum(&dq,arbitrary,status);
    if (U_ZERO_ERROR < *status) goto LAB_00263e51;
  }
  DecimalQuantity::adjustMagnitude(&dq,magnitude);
  DecimalQuantity::roundToInfinity(&dq);
  DecimalQuantity::toPlainString(&local_60,&dq);
  UnicodeString::append(sb,&local_60);
  UnicodeString::~UnicodeString(&local_60);
LAB_00263e51:
  DecimalQuantity::~DecimalQuantity(&dq);
  return;
}

Assistant:

void blueprint_helpers::generateScaleOption(int32_t magnitude, const DecNum* arbitrary, UnicodeString& sb,
                                            UErrorCode& status) {
    // Utilize DecimalQuantity/double_conversion to format this for us.
    DecimalQuantity dq;
    if (arbitrary != nullptr) {
        dq.setToDecNum(*arbitrary, status);
        if (U_FAILURE(status)) { return; }
    } else {
        dq.setToInt(1);
    }
    dq.adjustMagnitude(magnitude);
    dq.roundToInfinity();
    sb.append(dq.toPlainString());
}